

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScenePrivate::_q_processDirtyItems(QGraphicsScenePrivate *this)

{
  uint uVar1;
  bool bVar2;
  const_iterator o;
  const_iterator o_00;
  QGraphicsViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsView *view_1;
  add_const_t<QList<QGraphicsView_*>_> *__range1_2;
  QGraphicsView *view;
  add_const_t<QList<QGraphicsView_*>_> *__range1_1;
  QGraphicsItem *topLevelItem_1;
  add_const_t<QList<QGraphicsItem_*>_> *__range1;
  bool wasPendingSceneUpdate;
  QGraphicsItem *topLevelItem;
  add_const_t<QList<QGraphicsItem_*>_> *__range2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  QRectF oldGrowingItemsBoundingRect;
  const_iterator __end2;
  const_iterator __begin2;
  QRectF *in_stack_ffffffffffffff18;
  QGraphicsItem *in_stack_ffffffffffffff28;
  QGraphicsScenePrivate *in_stack_ffffffffffffff30;
  QGraphicsViewPrivate *this_00;
  const_iterator local_78;
  QGraphicsView **local_70;
  const_iterator local_68;
  const_iterator local_60;
  QGraphicsItem **local_58;
  const_iterator local_50;
  const_iterator local_48;
  QGraphicsEffect *local_40;
  undefined8 local_38;
  QRegionData *local_30;
  QRegionData *local_28;
  qreal in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  const_iterator in_stack_fffffffffffffff0;
  QGraphicsScenePrivate *this_01;
  
  this_01 = *(QGraphicsScenePrivate **)(in_FS_OFFSET + 0x28);
  *(uint *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
            extraPaintEngine =
       *(uint *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
                 .extraPaintEngine & 0xffffffef;
  if ((*(uint *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
                 .extraPaintEngine >> 2 & 1) == 0) {
    uVar1 = *(uint *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                      super_QWidgetPrivate.extraPaintEngine;
    local_40 = (in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
               graphicsEffect;
    local_38 = *(undefined8 *)
                &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
                 .imHints;
    local_30 = (in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
               opaqueChildren.d;
    local_28 = (in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
               dirty.d;
    local_48.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = in_RDI;
    local_48 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)in_RDI);
    local_50.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_50 = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)in_RDI);
    while( true ) {
      local_58 = local_50.i;
      bVar2 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_48,local_50);
      if (!bVar2) break;
      QList<QGraphicsItem_*>::const_iterator::operator*(&local_48);
      processDirtyItemsRecursive
                (this_01,(QGraphicsItem *)in_stack_fffffffffffffff0.i,
                 SUB81((ulong)in_stack_ffffffffffffffe8 >> 0x38,0),in_stack_ffffffffffffffe0);
      QList<QGraphicsItem_*>::const_iterator::operator++(&local_48);
    }
    *(uint *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              extraPaintEngine =
         *(uint *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                   super_QWidgetPrivate.extraPaintEngine & 0xfffffffd;
    if ((((ulong)(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
                 .extraPaintEngine & 1) == 0) &&
       (bVar2 = ::operator!=((QRectF *)in_RDI,in_stack_ffffffffffffff18), bVar2)) {
      q_func((QGraphicsScenePrivate *)in_RDI);
      QGraphicsScene::sceneRectChanged((QGraphicsScene *)in_RDI,in_stack_ffffffffffffff18);
    }
    if ((uVar1 >> 3 & 1) == 0) {
      local_60.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
      local_60 = QList<QGraphicsView_*>::begin((QList<QGraphicsView_*> *)in_RDI);
      local_68.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = QList<QGraphicsView_*>::end((QList<QGraphicsView_*> *)in_RDI);
      while( true ) {
        local_70 = local_68.i;
        bVar2 = QList<QGraphicsView_*>::const_iterator::operator!=(&local_60,local_68);
        if (!bVar2) break;
        QList<QGraphicsView_*>::const_iterator::operator*(&local_60);
        QGraphicsView::d_func((QGraphicsView *)0x9c1958);
        QGraphicsViewPrivate::processPendingUpdates(in_RDI);
        QList<QGraphicsView_*>::const_iterator::operator++(&local_60);
      }
      if ((*(uint *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                     super_QWidgetPrivate.extraPaintEngine >> 3 & 1) != 0) {
        _q_emitUpdated((QGraphicsScenePrivate *)this_00);
      }
      local_78.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = QList<QGraphicsView_*>::begin((QList<QGraphicsView_*> *)in_RDI);
      o_00 = QList<QGraphicsView_*>::end((QList<QGraphicsView_*> *)in_RDI);
      while (bVar2 = QList<QGraphicsView_*>::const_iterator::operator!=(&local_78,o_00), bVar2) {
        QList<QGraphicsView_*>::const_iterator::operator*(&local_78);
        QGraphicsView::d_func((QGraphicsView *)0x9c1a1f);
        QGraphicsViewPrivate::dispatchPendingUpdateRequests(in_RDI);
        QList<QGraphicsView_*>::const_iterator::operator++(&local_78);
      }
    }
  }
  else {
    QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)in_RDI);
    o = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)in_RDI);
    while (bVar2 = QList<QGraphicsItem_*>::const_iterator::operator!=
                             ((const_iterator *)&stack0xfffffffffffffff0,o), bVar2) {
      QList<QGraphicsItem_*>::const_iterator::operator*((const_iterator *)&stack0xfffffffffffffff0);
      resetDirtyItem(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                     SUB81((ulong)in_RDI >> 0x38,0));
      QList<QGraphicsItem_*>::const_iterator::operator++((const_iterator *)&stack0xfffffffffffffff0)
      ;
    }
  }
  if (*(QGraphicsScenePrivate **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::_q_processDirtyItems()
{
    processDirtyItemsEmitted = false;

    if (updateAll) {
        Q_ASSERT(calledEmitUpdated);
        // No need for further processing (except resetting the dirty states).
        // The growingItemsBoundingRect is updated in _q_emitUpdated.
        for (auto topLevelItem : std::as_const(topLevelItems))
            resetDirtyItem(topLevelItem, /*recursive=*/true);
        return;
    }

    const bool wasPendingSceneUpdate = calledEmitUpdated;
    const QRectF oldGrowingItemsBoundingRect = growingItemsBoundingRect;

    // Process items recursively.
    for (auto topLevelItem : std::as_const(topLevelItems))
        processDirtyItemsRecursive(topLevelItem);

    dirtyGrowingItemsBoundingRect = false;
    if (!hasSceneRect && oldGrowingItemsBoundingRect != growingItemsBoundingRect)
        emit q_func()->sceneRectChanged(growingItemsBoundingRect);

    if (wasPendingSceneUpdate)
        return;

    for (auto view : std::as_const(views))
        view->d_func()->processPendingUpdates();

    if (calledEmitUpdated) {
        // We did a compatibility QGraphicsScene::update in processDirtyItemsRecursive
        // and we cannot wait for the control to reach the eventloop before the
        // changed signal is emitted, so we emit it now.
        _q_emitUpdated();
    }

    // Immediately dispatch all pending update requests on the views.
    for (auto view : std::as_const(views))
        view->d_func()->dispatchPendingUpdateRequests();
}